

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keeper_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mem;
  
  pcVar1 = (state->cur_)._M_current;
  save_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&mem,(detail *)state,next);
  cVar2 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
  (state->action_list_).next = mem.action_list_head_;
  state->action_list_tail_ = mem.action_list_tail_;
  *mem.action_list_tail_ = (actionable *)0x0;
  if (cVar2 == '\0') {
    bVar3 = false;
    reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&mem,state,false);
  }
  else {
    cVar2 = (**(code **)((next->cur_)._M_current + 0x10))(next,state);
    if (cVar2 == '\0') {
      restore_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&mem,state);
      (state->cur_)._M_current = pcVar1;
      bVar3 = false;
    }
    else {
      reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&mem,state,true);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::false_) const
        {
            BidiIter const tmp = state.cur_;

            // matching xpr could produce side-effects, save state
            memento<BidiIter> mem = save_sub_matches(state);

            if(!this->xpr_.match(state))
            {
                restore_action_queue(mem, state);
                reclaim_sub_matches(mem, state, false);
                return false;
            }
            restore_action_queue(mem, state);
            if(next.match(state))
            {
                reclaim_sub_matches(mem, state, true);
                return true;
            }

            restore_sub_matches(mem, state);
            state.cur_ = tmp;
            return false;
        }